

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

bool __thiscall ON_OutlineFigure::IsValidFigure(ON_OutlineFigure *this,bool bLogErrors)

{
  ON_OutlineFigurePoint *pOVar1;
  ON_OutlineFigurePoint *pOVar2;
  ON__UINT16 OVar3;
  bool bVar4;
  bool bVar5;
  ON__UINT32 OVar6;
  char *sFormat;
  long lVar7;
  ulong uVar8;
  int line_number;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ON_OutlineFigurePoint local_80;
  ON_OutlineFigurePoint figure_start;
  ON_OutlineFigurePoint figure_end;
  
  OVar6 = Internal_FigureEndDex(this,bLogErrors);
  if (OVar6 == 0) {
LAB_004afc63:
    bVar4 = false;
  }
  else {
    pOVar2 = (this->m_points).m_a;
    figure_start.m_point.y = (pOVar2->m_point).y;
    figure_start.m_point_type = pOVar2->m_point_type;
    figure_start.m_point_proximity = pOVar2->m_point_proximity;
    figure_start.m_figure_index = pOVar2->m_figure_index;
    figure_start.m_point.x = (pOVar2->m_point).x;
    bVar4 = ON_OutlineFigurePoint::IsBeginFigurePoint(&figure_start);
    if (bVar4) {
      if (figure_start.m_point_type == BeginFigureUnknown) {
        if (!bLogErrors) goto LAB_004afc63;
        sFormat = 
        "m_outline_points[figure_start_dex] is ON_OutlineFigurePoint::Type::BeginFigureUnknown.";
        bVar4 = false;
        line_number = 0xaa5;
      }
      else {
        OVar3 = figure_start.m_figure_index;
        if (figure_start.m_figure_index == 0) {
          if (!bLogErrors) goto LAB_004afc63;
          sFormat = "BeginFigure point has 0 = m_contour_index.";
          bVar4 = false;
          line_number = 0xaac;
        }
        else {
          uVar8 = (ulong)OVar6;
          pOVar1 = pOVar2 + uVar8;
          figure_end.m_point_type = pOVar1->m_point_type;
          figure_end.m_point_proximity = pOVar1->m_point_proximity;
          figure_end.m_figure_index = pOVar1->m_figure_index;
          figure_end.m_point.x = (pOVar1->m_point).x;
          figure_end.m_point.y = pOVar2[uVar8].m_point.y;
          if (figure_start.m_figure_index == figure_end.m_figure_index) {
            bVar4 = ON_OutlineFigurePoint::IsOnFigure(&figure_start);
            if (bVar4) {
              bVar4 = ON_OutlineFigurePoint::IsOnFigure(&figure_end);
              if (bVar4) {
                if (figure_start.m_point_type == BeginFigureOpen) {
                  if (figure_end.m_point_type == EndFigureOpen) {
LAB_004afa78:
                    uVar9 = 1;
                    do {
                      bVar4 = OVar6 <= uVar9;
                      if (bVar4) {
                        return bVar4;
                      }
                      uVar10 = (ulong)uVar9;
                      pOVar1 = pOVar2 + uVar10;
                      local_80.m_point_type = pOVar1->m_point_type;
                      local_80.m_point_proximity = pOVar1->m_point_proximity;
                      local_80.m_figure_index = pOVar1->m_figure_index;
                      local_80.m_point.x = (pOVar1->m_point).x;
                      local_80.m_point.y = pOVar2[uVar10].m_point.y;
                      if (OVar3 != local_80.m_figure_index) {
                        if (!bLogErrors) {
                          return bVar4;
                        }
                        sFormat = 
                        "BeginFigure and interior point have different m_contour_index values.";
                        line_number = 0xae4;
                        goto LAB_004af90b;
                      }
                      if (local_80.m_point_type == CubicBezierPoint) {
                        bVar5 = ON_OutlineFigurePoint::IsOffFigure(&local_80);
                        if (!bVar5) {
                          if (!bLogErrors) {
                            return bVar4;
                          }
                          sFormat = "Interior CubicBezierPoint point IsOffFigure() is false.";
                          line_number = 0xb19;
                          goto LAB_004af90b;
                        }
                        uVar11 = uVar10;
                        for (lVar7 = 0; (int)lVar7 != 0x18; lVar7 = lVar7 + 0xc) {
                          uVar11 = uVar11 + 1;
                          if (uVar8 <= uVar11) {
                            if (!bLogErrors) {
                              return bVar4;
                            }
                            sFormat = "Invalid CubicBezierPoint segment.";
                            line_number = 0xb21;
                            goto LAB_004af90b;
                          }
                          local_80._0_8_ = *(undefined8 *)(&pOVar2[uVar10 + 1].m_point_type + lVar7)
                          ;
                          local_80.m_point.y =
                               *(float *)((long)&pOVar2[uVar10 + 1].m_point.y + lVar7);
                          if (OVar3 != local_80.m_figure_index) {
                            if (!bLogErrors) {
                              return bVar4;
                            }
                            sFormat = 
                            "BeginFigure and interior point have different m_contour_index values.";
                            line_number = 0xb28;
                            goto LAB_004af90b;
                          }
                          if (local_80.m_point_type != CubicBezierPoint) {
                            if (!bLogErrors) {
                              return bVar4;
                            }
                            sFormat = "Invalid end of QuadraticBezier segment point type.";
                            line_number = 0xb2e;
                            goto LAB_004af90b;
                          }
                          if ((int)lVar7 == 0) {
                            bVar5 = ON_OutlineFigurePoint::IsOffFigure(&local_80);
                            if (!bVar5) {
                              if (!bLogErrors) {
                                return bVar4;
                              }
                              sFormat = "Interior CubicBezierPoint point IsOffFigure() is false.";
                              line_number = 0xb36;
                              goto LAB_004af90b;
                            }
                          }
                          else {
                            bVar5 = ON_OutlineFigurePoint::IsOnFigure(&local_80);
                            if (!bVar5) {
                              if (!bLogErrors) {
                                return bVar4;
                              }
                              sFormat = "End of QuadraticBezier point IsOnFigure() is false.";
                              line_number = 0xb3e;
                              goto LAB_004af90b;
                            }
                          }
                        }
                      }
                      else if (local_80.m_point_type == QuadraticBezierPoint) {
                        bVar5 = ON_OutlineFigurePoint::IsOffFigure(&local_80);
                        if (!bVar5) {
                          if (!bLogErrors) {
                            return bVar4;
                          }
                          sFormat = "Interior QuadraticBezier point IsOffFigure() is false.";
                          line_number = 0xaf6;
                          goto LAB_004af90b;
                        }
                        uVar9 = uVar9 + 1;
                        uVar11 = (ulong)uVar9;
                        if (OVar6 <= uVar9) {
                          if (!bLogErrors) {
                            return bVar4;
                          }
                          sFormat = "Invalid QuadraticBezier segment.";
                          line_number = 0xafc;
                          goto LAB_004af90b;
                        }
                        pOVar1 = pOVar2 + uVar9;
                        local_80.m_point_type = pOVar1->m_point_type;
                        local_80.m_point_proximity = pOVar1->m_point_proximity;
                        local_80.m_figure_index = pOVar1->m_figure_index;
                        local_80.m_point.x = (pOVar1->m_point).x;
                        local_80.m_point.y = pOVar2[uVar9].m_point.y;
                        if (OVar3 != local_80.m_figure_index) {
                          if (!bLogErrors) {
                            return bVar4;
                          }
                          sFormat = 
                          "BeginFigure and interior point have different m_contour_index values.";
                          line_number = 0xb03;
                          goto LAB_004af90b;
                        }
                        if (local_80.m_point_type != QuadraticBezierPoint) {
                          if (!bLogErrors) {
                            return bVar4;
                          }
                          sFormat = "Invalid end of QuadraticBezier segment point type.";
                          line_number = 0xb09;
                          goto LAB_004af90b;
                        }
                        bVar5 = ON_OutlineFigurePoint::IsOnFigure(&local_80);
                        if (!bVar5) {
                          if (!bLogErrors) {
                            return bVar4;
                          }
                          sFormat = "End of QuadraticBezier point IsOnFigure() is false.";
                          line_number = 0xb0f;
                          goto LAB_004af90b;
                        }
                      }
                      else {
                        uVar11 = (ulong)uVar9;
                        if (local_80.m_point_type != LineTo) {
                          if (!bLogErrors) {
                            return bVar4;
                          }
                          sFormat = "Invalid point type for figure interior.";
                          line_number = 0xb46;
                          goto LAB_004af90b;
                        }
                        bVar5 = ON_OutlineFigurePoint::IsOnFigure(&local_80);
                        if (!bVar5) {
                          if (!bLogErrors) {
                            return bVar4;
                          }
                          sFormat = "LineTo point IsOnFigure() is false.";
                          line_number = 0xaec;
                          goto LAB_004af90b;
                        }
                      }
                      uVar9 = (int)uVar11 + 1;
                    } while( true );
                  }
                  if (!bLogErrors) goto LAB_004afc63;
                  sFormat = "Open figure is not terminated with an EndFigureOpen point.";
                  bVar4 = false;
                  line_number = 0xad5;
                }
                else if (figure_end.m_point_type == EndFigureClosed) {
                  bVar4 = ON_2fPoint::operator==(&figure_start.m_point,&figure_end.m_point);
                  if (bVar4) goto LAB_004afa78;
                  if (!bLogErrors) goto LAB_004afc63;
                  sFormat = "Closed figure has different start and end points.";
                  bVar4 = false;
                  line_number = 0xacd;
                }
                else {
                  if (!bLogErrors) goto LAB_004afc63;
                  sFormat = "Closed figure is not terminated with an EndFigureClosed point.";
                  bVar4 = false;
                  line_number = 0xac8;
                }
              }
              else {
                if (!bLogErrors) goto LAB_004afc63;
                sFormat = "EndFigure point IsOnFigure() is false.";
                bVar4 = false;
                line_number = 0xabf;
              }
            }
            else {
              if (!bLogErrors) goto LAB_004afc63;
              sFormat = "BeginFigure point IsOnFigure() is false.";
              bVar4 = false;
              line_number = 0xab9;
            }
          }
          else {
            if (!bLogErrors) goto LAB_004afc63;
            sFormat = "BeginFigure and EndFigure points have different m_contour_index values.";
            bVar4 = false;
            line_number = 0xab3;
          }
        }
      }
    }
    else {
      if (!bLogErrors) goto LAB_004afc63;
      sFormat = "m_points[0] is not a BeginFigure point.";
      bVar4 = false;
      line_number = 0xa9f;
    }
LAB_004af90b:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,line_number,"",sFormat);
  }
  return bVar4;
}

Assistant:

bool ON_OutlineFigure::IsValidFigure(
  bool bLogErrors
) const
{
  const ON__UINT32 figure_end_dex = Internal_FigureEndDex(bLogErrors);
  if (0 == figure_end_dex)
  {
    return false;
  }

  const ON_OutlineFigurePoint* a = m_points.Array();


  const ON_OutlineFigurePoint figure_start = a[0];
  if (false == figure_start.IsBeginFigurePoint())
  {
    if ( bLogErrors ) ON_ERROR("m_points[0] is not a BeginFigure point.");
    return false;
  }
  if ( ON_OutlineFigurePoint::Type::BeginFigureUnknown == figure_start.m_point_type)
  {
    // Finished figures never have BeginFigureUnknown point type.
    if ( bLogErrors ) ON_ERROR("m_outline_points[figure_start_dex] is ON_OutlineFigurePoint::Type::BeginFigureUnknown.");
    return false;
  }

  const ON__UINT16 figure_id = figure_start.m_figure_index;
  if (0 == figure_id)
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure point has 0 = m_contour_index.");
    return false;
  }

  const ON_OutlineFigurePoint figure_end = a[figure_end_dex];
  if (figure_id != figure_end.m_figure_index)
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure and EndFigure points have different m_contour_index values.");
    return false;
  }

  if ( false == figure_start.IsOnFigure())
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure point IsOnFigure() is false.");
    return false;
  }

  if (false == figure_end.IsOnFigure())
  {
    if ( bLogErrors ) ON_ERROR("EndFigure point IsOnFigure() is false.");
    return false;
  }

  const bool bClosedFigure = (ON_OutlineFigurePoint::Type::BeginFigureOpen != figure_start.m_point_type);
  if (bClosedFigure)
  {
    if (ON_OutlineFigurePoint::Type::EndFigureClosed != figure_end.m_point_type)
    {
      if ( bLogErrors ) ON_ERROR("Closed figure is not terminated with an EndFigureClosed point.");
      return false;
    }
    if (false == (figure_start.m_point == figure_end.m_point))
    {
      if ( bLogErrors ) ON_ERROR("Closed figure has different start and end points.");
      return false;
    }
  }
  else
  {
    if (ON_OutlineFigurePoint::Type::EndFigureOpen != figure_end.m_point_type)
    {
      if ( bLogErrors ) ON_ERROR("Open figure is not terminated with an EndFigureOpen point.");
      return false;
    }
  }

  // Validate EndFigure bToPoint setting.

  ON_OutlineFigurePoint p0, p1;
  p1 = figure_start;
  for (ON__UINT32 i = 1; i < figure_end_dex; i++)
  {
    p0 = p1;
    p1 = a[i];
    if (figure_id != p1.m_figure_index)
    {
      if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
      return false;
    }
    
    if (ON_OutlineFigurePoint::Type::LineTo == p1.m_point_type)
    {
      if (false == p1.IsOnFigure())
      {
        if (bLogErrors) ON_ERROR("LineTo point IsOnFigure() is false.");
        return false;
      }
      continue;
    }

    if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint == p1.m_point_type)
    {
      if (false == p1.IsOffFigure())
      {
        if (bLogErrors) ON_ERROR("Interior QuadraticBezier point IsOffFigure() is false.");
        return false;
      }

      if (i + 1 >= figure_end_dex)
      {
        if (bLogErrors) ON_ERROR("Invalid QuadraticBezier segment.");
        return false;
      }

      p1 = a[++i];
      if (figure_id != p1.m_figure_index)
      {
        if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
        return false;
      }

      if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint != p1.m_point_type)
      {
        if (bLogErrors) ON_ERROR("Invalid end of QuadraticBezier segment point type.");
        return false;
      }

      if (false == p1.IsOnFigure())
      {
        if (bLogErrors) ON_ERROR("End of QuadraticBezier point IsOnFigure() is false.");
        return false;
      }
      continue;
    }

    if (ON_OutlineFigurePoint::Type::CubicBezierPoint == p1.m_point_type)
    {
      if (false == p1.IsOffFigure())
      {
        if (bLogErrors) ON_ERROR("Interior CubicBezierPoint point IsOffFigure() is false.");
        return false;
      }

      for (int cv_dex = 2; cv_dex <= 3; cv_dex++)
      {
        if (i + 1 >= figure_end_dex)
        {
          if (bLogErrors) ON_ERROR("Invalid CubicBezierPoint segment.");
          return false;
        }

        p1 = a[++i];
        if (figure_id != p1.m_figure_index)
        {
          if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
          return false;
        }

        if (ON_OutlineFigurePoint::Type::CubicBezierPoint != p1.m_point_type)
        {
          if (bLogErrors) ON_ERROR("Invalid end of QuadraticBezier segment point type.");
          return false;
        }

        if (2 == cv_dex)
        {
          if (false == p1.IsOffFigure())
          {
            if (bLogErrors) ON_ERROR("Interior CubicBezierPoint point IsOffFigure() is false.");
            return false;
          }
        }
        else
        {
          if (false == p1.IsOnFigure())
          {
            if (bLogErrors) ON_ERROR("End of QuadraticBezier point IsOnFigure() is false.");
            return false;
          }
        }
      }
      continue;
    }

    if (bLogErrors) ON_ERROR("Invalid point type for figure interior.");
    return false;
  }

  return true;
}